

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O1

cilkred_map ** fast_path_reductions_for_spawn_return(__cilkrts_worker *w,full_frame *ff)

{
  full_frame *pfVar1;
  pending_exception_info *ppVar2;
  cilkred_map *pcVar3;
  byte bVar4;
  cilkred_map **ppcVar5;
  pending_exception_info **pppVar6;
  cilkred_map **ppcVar7;
  cilkred_map **ppcVar8;
  
  if (w->l->pending_exception == (pending_exception_info *)0x0) {
    pfVar1 = ff->left_sibling;
    if (pfVar1 == (full_frame *)0x0) {
      ppcVar5 = &ff->parent->children_reducer_map;
      pppVar6 = &ff->parent->child_pending_exception;
    }
    else {
      ppcVar5 = &pfVar1->right_reducer_map;
      pppVar6 = &pfVar1->right_pending_exception;
    }
    ppVar2 = __cilkrts_merge_pending_exceptions(w,*pppVar6,ff->pending_exception);
    *pppVar6 = ppVar2;
    ff->pending_exception = (pending_exception_info *)0x0;
    ppVar2 = __cilkrts_merge_pending_exceptions(w,*pppVar6,ff->right_pending_exception);
    *pppVar6 = ppVar2;
    ff->right_pending_exception = (pending_exception_info *)0x0;
    bVar4 = (*ppcVar5 != (cilkred_map *)0x0) + (w->reducer_map != (cilkred_map *)0x0) * '\x02' +
            (ff->right_reducer_map != (cilkred_map *)0x0) * '\x04';
    ppcVar8 = (cilkred_map **)0x0;
    if ((1 < bVar4) &&
       ((pcVar3 = w->reducer_map, ppcVar7 = &w->reducer_map, bVar4 == 2 ||
        (pcVar3 = ff->right_reducer_map, ppcVar7 = &ff->right_reducer_map, ppcVar8 = ppcVar5,
        bVar4 == 4)))) {
      *ppcVar5 = pcVar3;
      *ppcVar7 = (cilkred_map *)0x0;
      ppcVar8 = (cilkred_map **)0x0;
    }
    return ppcVar8;
  }
  fast_path_reductions_for_spawn_return_cold_1();
}

Assistant:

struct cilkred_map**
fast_path_reductions_for_spawn_return(__cilkrts_worker *w,
                                      full_frame *ff)
{
    // ASSERT: we hold ff->parent->lock.
    splice_left_ptrs left_ptrs;

    CILK_ASSERT(NULL == w->l->pending_exception);

    // Figure out the pointers to the left where I want
    // to put reducers and exceptions.
    left_ptrs = compute_left_ptrs_for_spawn_return(w, ff);
    
    // Go ahead and merge exceptions while holding the lock.
    splice_exceptions_for_spawn(w, ff, left_ptrs.exception_ptr);

    // Now check if we have any reductions to perform.
    //
    // Consider all the cases of left, middle and right maps.
    //  0. (-, -, -)  :  finish and return 1
    //  1. (L, -, -)  :  finish and return 1
    //  2. (-, M, -)  :  slide over to left, finish, and return 1.
    //  3. (L, M, -)  :  return 0
    //  4. (-, -, R)  :  slide over to left, finish, and return 1.
    //  5. (L, -, R)  :  return 0
    //  6. (-, M, R)  :  return 0
    //  7. (L, M, R)  :  return 0
    //
    // In terms of code:
    //  L == *left_ptrs.map_ptr
    //  M == w->reducer_map
    //  R == f->right_reducer_map.
    //
    // The goal of the code below is to execute the fast path with
    // as few branches and writes as possible.
    
    int case_value = (*(left_ptrs.map_ptr) != NULL);
    case_value += ((w->reducer_map != NULL) << 1);
    case_value += ((ff->right_reducer_map != NULL) << 2);

    // Fastest path is case_value == 0 or 1.
    if (case_value >=2) {
        switch (case_value) {
        case 2:
            *(left_ptrs.map_ptr) = w->reducer_map;
            w->reducer_map = NULL;
            return NULL;
            break;
        case 4:
            *(left_ptrs.map_ptr) = ff->right_reducer_map;
            ff->right_reducer_map = NULL;
            return NULL;
        default:
            // If we have to execute the slow path, then
            // return the pointer to the place to deposit the left
            // map.
            return left_ptrs.map_ptr;
        }
    }

    // Do nothing
    return NULL;
}